

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2Impl::decomposeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doDecompose,UnicodeString *safeMiddle
          ,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UChar UVar1;
  UChar UVar2;
  ushort uVar3;
  UCPTrie *trie;
  UBool UVar4;
  ushort uVar5;
  bool bVar6;
  int iVar7;
  uint8_t trailCC;
  UChar *pUVar9;
  UChar *s;
  uint8_t leadCC;
  ushort uVar8;
  ushort uVar10;
  
  ReorderingBuffer::copyReorderableSuffixTo(buffer,safeMiddle);
  if (doDecompose != '\0') {
    decompose(this,src,limit,buffer,errorCode);
    return;
  }
  bVar6 = true;
  uVar8 = 0;
  uVar10 = 0;
  s = src;
  do {
    trailCC = (uint8_t)uVar8;
    leadCC = (uint8_t)uVar10;
    if (s == limit) break;
    pUVar9 = s + 1;
    UVar1 = *s;
    if ((UVar1 & 0xf800U) == 0xd800) {
      if ((pUVar9 == limit || ((byte)((ushort)UVar1 >> 10) & 1) != 0) ||
         (UVar2 = *pUVar9, (UVar2 & 0xfc00U) != 0xdc00)) {
        iVar7 = this->normTrie->dataLength + -1;
      }
      else {
        pUVar9 = s + 2;
        iVar7 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)UVar2 + -0x35fdc00;
        trie = this->normTrie;
        if (iVar7 < trie->highStart) {
          iVar7 = ucptrie_internalSmallIndex_63(trie,iVar7);
        }
        else {
          iVar7 = trie->dataLength + -2;
        }
      }
    }
    else {
      iVar7 = ((ushort)UVar1 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    uVar3 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar7 * 2);
    if (uVar3 < 0xfc00) {
      uVar5 = 0;
      if ((this->minNoNo <= uVar3) && (uVar3 < this->limitNoNo)) {
        if ((*(byte *)((long)this->extraData + (ulong)(uVar3 & 0xfffffffe)) & 0x80) == 0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (ushort)(byte)this->extraData[(ulong)(uVar3 >> 1) - 1];
        }
      }
    }
    else {
      uVar5 = uVar3 >> 1;
    }
    if (((char)uVar5 != '\0') && (s = pUVar9, uVar8 = uVar5, bVar6)) {
      bVar6 = false;
      uVar10 = uVar5 & 0xff;
    }
    trailCC = (uint8_t)uVar8;
    leadCC = (uint8_t)uVar10;
  } while ((char)uVar5 != '\0');
  if (limit == (UChar *)0x0) {
    limit = u_strchr_63(s,L'\0');
  }
  UVar4 = ReorderingBuffer::append
                    (buffer,src,(int32_t)((ulong)((long)s - (long)src) >> 1),'\0',leadCC,trailCC,
                     errorCode);
  if (UVar4 != '\0') {
    ReorderingBuffer::appendZeroCC(buffer,s,limit,errorCode);
    return;
  }
  return;
}

Assistant:

void Normalizer2Impl::decomposeAndAppend(const UChar *src, const UChar *limit,
                                         UBool doDecompose,
                                         UnicodeString &safeMiddle,
                                         ReorderingBuffer &buffer,
                                         UErrorCode &errorCode) const {
    buffer.copyReorderableSuffixTo(safeMiddle);
    if(doDecompose) {
        decompose(src, limit, &buffer, errorCode);
        return;
    }
    // Just merge the strings at the boundary.
    bool isFirst = true;
    uint8_t firstCC = 0, prevCC = 0, cc;
    const UChar *p = src;
    while (p != limit) {
        const UChar *codePointStart = p;
        UChar32 c;
        uint16_t norm16;
        UCPTRIE_FAST_U16_NEXT(normTrie, UCPTRIE_16, p, limit, c, norm16);
        if ((cc = getCC(norm16)) == 0) {
            p = codePointStart;
            break;
        }
        if (isFirst) {
            firstCC = cc;
            isFirst = false;
        }
        prevCC = cc;
    }
    if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
        limit=u_strchr(p, 0);
    }

    if (buffer.append(src, (int32_t)(p - src), FALSE, firstCC, prevCC, errorCode)) {
        buffer.appendZeroCC(p, limit, errorCode);
    }
}